

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetShaderResourceTypeLiteralName
                 (SHADER_RESOURCE_TYPE ResourceType,bool bGetFullName)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,ResourceType) & 0xffffffff) {
  case 0:
    pcVar2 = "SHADER_RESOURCE_TYPE_UNKNOWN";
    pcVar1 = "unknown";
    break;
  case 1:
    pcVar2 = "SHADER_RESOURCE_TYPE_CONSTANT_BUFFER";
    pcVar1 = "constant buffer";
    break;
  case 2:
    pcVar2 = "SHADER_RESOURCE_TYPE_TEXTURE_SRV";
    pcVar1 = "texture SRV";
    break;
  case 3:
    pcVar2 = "SHADER_RESOURCE_TYPE_BUFFER_SRV";
    pcVar1 = "buffer SRV";
    break;
  case 4:
    pcVar2 = "SHADER_RESOURCE_TYPE_TEXTURE_UAV";
    pcVar1 = "texture UAV";
    break;
  case 5:
    pcVar2 = "SHADER_RESOURCE_TYPE_BUFFER_UAV";
    pcVar1 = "buffer UAV";
    break;
  case 6:
    pcVar2 = "SHADER_RESOURCE_TYPE_SAMPLER";
    pcVar1 = "sampler";
    break;
  case 7:
    pcVar2 = "SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT";
    pcVar1 = "input attachment";
    break;
  case 8:
    pcVar2 = "SHADER_RESOURCE_TYPE_ACCEL_STRUCT";
    pcVar1 = "acceleration structure";
    break;
  default:
    local_2c = (uint)ResourceType;
    FormatString<char[27],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Unexpected resource type (",(char (*) [27])&local_2c,
               (uint *)0x2caa26,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderResourceTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x370);
    std::__cxx11::string::~string((string *)&local_28);
    return "UNKNOWN";
  }
  if (bGetFullName) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetShaderResourceTypeLiteralName(SHADER_RESOURCE_TYPE ResourceType, bool bGetFullName)
{
    static_assert(SHADER_RESOURCE_TYPE_LAST == 8, "Please update the switch below to handle the new shader resource type");
    switch (ResourceType)
    {
        // clang-format off
        case SHADER_RESOURCE_TYPE_UNKNOWN:          return bGetFullName ?  "SHADER_RESOURCE_TYPE_UNKNOWN"          : "unknown";
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:  return bGetFullName ?  "SHADER_RESOURCE_TYPE_CONSTANT_BUFFER"  : "constant buffer";
        case SHADER_RESOURCE_TYPE_TEXTURE_SRV:      return bGetFullName ?  "SHADER_RESOURCE_TYPE_TEXTURE_SRV"      : "texture SRV";
        case SHADER_RESOURCE_TYPE_BUFFER_SRV:       return bGetFullName ?  "SHADER_RESOURCE_TYPE_BUFFER_SRV"       : "buffer SRV";
        case SHADER_RESOURCE_TYPE_TEXTURE_UAV:      return bGetFullName ?  "SHADER_RESOURCE_TYPE_TEXTURE_UAV"      : "texture UAV";
        case SHADER_RESOURCE_TYPE_BUFFER_UAV:       return bGetFullName ?  "SHADER_RESOURCE_TYPE_BUFFER_UAV"       : "buffer UAV";
        case SHADER_RESOURCE_TYPE_SAMPLER:          return bGetFullName ?  "SHADER_RESOURCE_TYPE_SAMPLER"          : "sampler";
        case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT: return bGetFullName ?  "SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT" : "input attachment";
        case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:     return bGetFullName ?  "SHADER_RESOURCE_TYPE_ACCEL_STRUCT"     : "acceleration structure";
        // clang-format on
        default:
            UNEXPECTED("Unexpected resource type (", Uint32{ResourceType}, ")");
            return "UNKNOWN";
    }
}